

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-udp-pummel.c
# Opt level: O0

int pummel(uint n_senders,uint n_receivers,unsigned_long timeout)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  uv_buf_t uVar9;
  sender_state *s_1;
  size_t local_128;
  char *local_120;
  size_t local_118;
  char *local_110;
  size_t local_108;
  char *local_100;
  size_t local_f8;
  char *local_f0;
  size_t local_e8;
  undefined1 local_e0 [8];
  sockaddr_in addr;
  receiver_state *s;
  uint i;
  uv_loop_t *loop;
  uint64_t duration;
  uv_timer_t timer_handle;
  unsigned_long timeout_local;
  uint n_receivers_local;
  uint n_senders_local;
  
  timer_handle.start_id = timeout;
  if (0x400 < n_senders) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
            ,0x9c,"n_senders <= ARRAY_SIZE(senders)");
    abort();
  }
  if (0x400 < n_receivers) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
            ,0x9d,"n_receivers <= ARRAY_SIZE(receivers)");
    abort();
  }
  puVar2 = uv_default_loop();
  n_senders_ = n_senders;
  n_receivers_ = n_receivers;
  if (timer_handle.start_id != 0) {
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&duration);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xa5,"0 == uv_timer_init(loop, &timer_handle)");
      abort();
    }
    iVar1 = uv_timer_start((uv_timer_t *)&duration,timeout_cb,timer_handle.start_id,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xa6,"0 == uv_timer_start(&timer_handle, timeout_cb, timeout, 0)");
      abort();
    }
    uv_unref((uv_handle_t *)&duration);
    timed = 1;
  }
  s._4_4_ = 0;
  while( true ) {
    if (n_receivers <= s._4_4_) {
      uVar9 = uv_buf_init("RANG TANG DING DONG I AM THE JAPANESE SANDMAN",10);
      local_f0 = uVar9.base;
      bufs[0].base = local_f0;
      local_e8 = uVar9.len;
      bufs[0].len = local_e8;
      uVar9 = uv_buf_init("DING DONG I AM THE JAPANESE SANDMAN",10);
      local_100 = uVar9.base;
      bufs[1].base = local_100;
      local_f8 = uVar9.len;
      bufs[1].len = local_f8;
      uVar9 = uv_buf_init("I AM THE JAPANESE SANDMAN",10);
      local_110 = uVar9.base;
      bufs[2].base = local_110;
      local_108 = uVar9.len;
      bufs[2].len = local_108;
      uVar9 = uv_buf_init("APANESE SANDMAN",10);
      local_120 = uVar9.base;
      bufs[3].base = local_120;
      local_118 = uVar9.len;
      bufs[3].len = local_118;
      uVar9 = uv_buf_init("NDMAN",5);
      s_1 = (sender_state *)uVar9.base;
      bufs[4].base = (char *)s_1;
      local_128 = uVar9.len;
      bufs[4].len = local_128;
      s._4_4_ = 0;
      while( true ) {
        if (n_senders <= s._4_4_) {
          uVar3 = uv_hrtime();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
                    ,0xcb,"0 == uv_run(loop, UV_RUN_DEFAULT)");
            abort();
          }
          uVar4 = uv_hrtime();
          uVar5 = (uVar4 - uVar3) / 1000000;
          auVar7._8_4_ = (int)(uVar5 >> 0x20);
          auVar7._0_8_ = uVar5;
          auVar7._12_4_ = 0x45300000;
          dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
          dVar8 = dVar6 / 1000.0;
          printf("udp_pummel_%dv%d: %.0f/s received, %.0f/s sent. %u received, %u sent in %.1f seconds.\n"
                 ,(double)recv_cb_called / dVar8,(double)send_cb_called / dVar8,dVar6 / 1000.0,
                 (ulong)n_receivers,(ulong)n_senders,(ulong)recv_cb_called,(ulong)send_cb_called);
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
                    ,0xda,"0 == uv_loop_close(uv_default_loop())");
            abort();
          }
          uv_library_shutdown();
          return 0;
        }
        uVar5 = (ulong)s._4_4_;
        iVar1 = uv_ip4_addr("127.0.0.1",s._4_4_ % n_receivers + 0x3039,&senders[uVar5].addr);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
                  ,0xc0,"0 == uv_ip4_addr(\"127.0.0.1\", BASE_PORT + (i % n_receivers), &s->addr)");
          abort();
        }
        iVar1 = uv_udp_init(puVar2,&senders[uVar5].udp_handle);
        if (iVar1 != 0) break;
        iVar1 = uv_udp_send(&senders[uVar5].send_req,&senders[uVar5].udp_handle,bufs,5,
                            (sockaddr *)(senders + uVar5),send_cb);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
                  ,199,
                  "0 == uv_udp_send(&s->send_req, &s->udp_handle, bufs, ARRAY_SIZE(bufs), (const struct sockaddr*) &s->addr, send_cb)"
                 );
          abort();
        }
        s._4_4_ = s._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xc1,"0 == uv_udp_init(loop, &s->udp_handle)");
      abort();
    }
    addr.sin_zero = (uchar  [8])(receivers + s._4_4_);
    iVar1 = uv_ip4_addr("0.0.0.0",s._4_4_ + 0x3039,(sockaddr_in *)local_e0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xaf,"0 == uv_ip4_addr(\"0.0.0.0\", BASE_PORT + i, &addr)");
      abort();
    }
    iVar1 = uv_udp_init(puVar2,(uv_udp_t *)((long)addr.sin_zero + 0x10));
    if (iVar1 != 0) break;
    iVar1 = uv_udp_bind((uv_udp_t *)((long)addr.sin_zero + 0x10),(sockaddr *)local_e0,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xb1,"0 == uv_udp_bind(&s->udp_handle, (const struct sockaddr*) &addr, 0)");
      abort();
    }
    iVar1 = uv_udp_recv_start((uv_udp_t *)((long)addr.sin_zero + 0x10),alloc_cb,recv_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
              ,0xb2,"0 == uv_udp_recv_start(&s->udp_handle, alloc_cb, recv_cb)");
      abort();
    }
    uv_unref((uv_handle_t *)((long)addr.sin_zero + 0x10));
    s._4_4_ = s._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-udp-pummel.c"
          ,0xb0,"0 == uv_udp_init(loop, &s->udp_handle)");
  abort();
}

Assistant:

static int pummel(unsigned int n_senders,
                  unsigned int n_receivers,
                  unsigned long timeout) {
  uv_timer_t timer_handle;
  uint64_t duration;
  uv_loop_t* loop;
  unsigned int i;

  ASSERT(n_senders <= ARRAY_SIZE(senders));
  ASSERT(n_receivers <= ARRAY_SIZE(receivers));

  loop = uv_default_loop();

  n_senders_ = n_senders;
  n_receivers_ = n_receivers;

  if (timeout) {
    ASSERT(0 == uv_timer_init(loop, &timer_handle));
    ASSERT(0 == uv_timer_start(&timer_handle, timeout_cb, timeout, 0));
    /* Timer should not keep loop alive. */
    uv_unref((uv_handle_t*)&timer_handle);
    timed = 1;
  }

  for (i = 0; i < n_receivers; i++) {
    struct receiver_state* s = receivers + i;
    struct sockaddr_in addr;
    ASSERT(0 == uv_ip4_addr("0.0.0.0", BASE_PORT + i, &addr));
    ASSERT(0 == uv_udp_init(loop, &s->udp_handle));
    ASSERT(0 == uv_udp_bind(&s->udp_handle, (const struct sockaddr*) &addr, 0));
    ASSERT(0 == uv_udp_recv_start(&s->udp_handle, alloc_cb, recv_cb));
    uv_unref((uv_handle_t*)&s->udp_handle);
  }

  bufs[0] = uv_buf_init(&EXPECTED[0],  10);
  bufs[1] = uv_buf_init(&EXPECTED[10], 10);
  bufs[2] = uv_buf_init(&EXPECTED[20], 10);
  bufs[3] = uv_buf_init(&EXPECTED[30], 10);
  bufs[4] = uv_buf_init(&EXPECTED[40], 5);

  for (i = 0; i < n_senders; i++) {
    struct sender_state* s = senders + i;
    ASSERT(0 == uv_ip4_addr("127.0.0.1",
                            BASE_PORT + (i % n_receivers),
                            &s->addr));
    ASSERT(0 == uv_udp_init(loop, &s->udp_handle));
    ASSERT(0 == uv_udp_send(&s->send_req,
                            &s->udp_handle,
                            bufs,
                            ARRAY_SIZE(bufs),
                            (const struct sockaddr*) &s->addr,
                            send_cb));
  }

  duration = uv_hrtime();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  duration = uv_hrtime() - duration;
  /* convert from nanoseconds to milliseconds */
  duration = duration / (uint64_t) 1e6;

  printf("udp_pummel_%dv%d: %.0f/s received, %.0f/s sent. "
         "%u received, %u sent in %.1f seconds.\n",
         n_receivers,
         n_senders,
         recv_cb_called / (duration / 1000.0),
         send_cb_called / (duration / 1000.0),
         recv_cb_called,
         send_cb_called,
         duration / 1000.0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}